

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mechanism.c
# Opt level: O0

int saslmechanism_challenge
              (SASL_MECHANISM_HANDLE sasl_mechanism,SASL_MECHANISM_BYTES *challenge_bytes,
              SASL_MECHANISM_BYTES *response_bytes)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  SASL_MECHANISM_BYTES *response_bytes_local;
  SASL_MECHANISM_BYTES *challenge_bytes_local;
  SASL_MECHANISM_HANDLE sasl_mechanism_local;
  
  if (sasl_mechanism == (SASL_MECHANISM_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_mechanism.c"
                ,"saslmechanism_challenge",0x91,1,"NULL sasl_mechanism");
    }
    l._4_4_ = 0x92;
  }
  else {
    iVar1 = (*sasl_mechanism->sasl_mechanism_interface_description->
              concrete_sasl_mechanism_challenge)
                      (sasl_mechanism->concrete_sasl_mechanism_handle,challenge_bytes,response_bytes
                      );
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_mechanism.c"
                  ,"saslmechanism_challenge",0x9a,1,"concrete_sasl_mechanism_challenge failed");
      }
      l._4_4_ = 0x9b;
    }
  }
  return l._4_4_;
}

Assistant:

int saslmechanism_challenge(SASL_MECHANISM_HANDLE sasl_mechanism, const SASL_MECHANISM_BYTES* challenge_bytes, SASL_MECHANISM_BYTES* response_bytes)
{
    int result;

    /* Codes_SRS_SASL_MECHANISM_01_020: [If the argument `sasl_mechanism` is NULL, `saslmechanism_challenge` shall fail and return a non-zero value.] */
    if (sasl_mechanism == NULL)
    {
        LogError("NULL sasl_mechanism");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_SASL_MECHANISM_01_018: [`saslmechanism_challenge` shall call the specific `concrete_sasl_mechanism_challenge` function specified in `saslmechanism_create`, while passing the `challenge_bytes` and `response_bytes` arguments to it.] */
        if (sasl_mechanism->sasl_mechanism_interface_description->concrete_sasl_mechanism_challenge(sasl_mechanism->concrete_sasl_mechanism_handle, challenge_bytes, response_bytes) != 0)
        {
            /* Codes_SRS_SASL_MECHANISM_01_021: [If the underlying `concrete_sasl_mechanism_challenge` fails, `saslmechanism_challenge` shall fail and return a non-zero value.] */
            LogError("concrete_sasl_mechanism_challenge failed");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_SASL_MECHANISM_01_019: [On success, `saslmechanism_challenge` shall return 0.] */
            result = 0;
        }
    }

    return result;
}